

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::update_dht_announce_interval(session_impl *this)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  anon_class_8_1_8991fb9c local_40;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  duration local_30;
  int local_28 [4];
  int local_18;
  int local_14;
  session_impl *psStack_10;
  int delay;
  session_impl *this_local;
  
  psStack_10 = this;
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_dht);
  if (bVar1) {
    sVar3 = torrent_list<libtorrent::aux::torrent>::size(&this->m_torrents);
    this->m_dht_interval_update_torrents = (int)sVar3;
    if ((this->m_abort & 1U) == 0) {
      iVar2 = session_settings::get_int(&this->m_settings,0x4044);
      sVar3 = torrent_list<libtorrent::aux::torrent>::size(&this->m_torrents);
      local_28[3] = (int)sVar3;
      local_28[2] = 1;
      piVar4 = ::std::max<int>(local_28 + 3,local_28 + 2);
      local_18 = (iVar2 * 1000) / *piVar4;
      local_28[1] = 1;
      piVar4 = ::std::max<int>(&local_18,local_28 + 1);
      local_14 = *piVar4;
      bVar1 = ::std::
              deque<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
              ::empty(&this->m_dht_torrents);
      if (!bVar1) {
        local_28[0] = 4000;
        piVar4 = ::std::min<int>(local_28,&local_14);
        local_14 = *piVar4;
      }
      ::std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&local_38,&local_14);
      ::std::chrono::duration<long,std::ratio<1l,1000000000l>>::
      duration<long,std::ratio<1l,1000l>,void>
                ((duration<long,std::ratio<1l,1000000000l>> *)&local_30,&local_38);
      boost::asio::
      basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::expires_after(&this->m_dht_announce_timer,&local_30);
      local_40.this = this;
      boost::asio::
      basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
      ::async_wait<libtorrent::aux::session_impl::update_dht_announce_interval()::__0>
                ((basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                  *)&this->m_dht_announce_timer,&local_40);
    }
    else {
      session_log(this,"not starting DHT announce timer: m_abort set");
    }
  }
  else {
    session_log(this,"not starting DHT announce timer: m_dht == nullptr");
  }
  return;
}

Assistant:

void session_impl::update_dht_announce_interval()
	{
#ifndef TORRENT_DISABLE_DHT
		if (!m_dht)
		{
#ifndef TORRENT_DISABLE_LOGGING
			session_log("not starting DHT announce timer: m_dht == nullptr");
#endif
			return;
		}

		m_dht_interval_update_torrents = int(m_torrents.size());

		if (m_abort)
		{
#ifndef TORRENT_DISABLE_LOGGING
			session_log("not starting DHT announce timer: m_abort set");
#endif
			return;
		}

		ADD_OUTSTANDING_ASYNC("session_impl::on_dht_announce");
		int delay = std::max(1000 * m_settings.get_int(settings_pack::dht_announce_interval)
			/ std::max(int(m_torrents.size()), 1), 1);

		if (!m_dht_torrents.empty())
		{
			// we have prioritized torrents that need
			// an initial DHT announce. Don't wait too long
			// until we announce those.
			delay = std::min(4000, delay);
		}

		m_dht_announce_timer.expires_after(milliseconds(delay));
		m_dht_announce_timer.async_wait([this](error_code const& e) {
			wrap(&session_impl::on_dht_announce, e); });
#endif
	}